

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O0

void __thiscall Poll::unsubscribe(Poll *this,Subscriber *sub)

{
  bool bVar1;
  reference ppVar2;
  pollfd *i;
  iterator __end1;
  iterator __begin1;
  vector<pollfd,_std::allocator<pollfd>_> *__range1;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<Subscriber>_>,_false> local_30;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<Subscriber>_>,_false> local_28;
  iterator it;
  int fd;
  Subscriber *sub_local;
  Poll *this_local;
  
  it.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Subscriber>_>,_false>._M_cur.
  _4_4_ = Subscriber::get_fd(sub);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<Subscriber>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Subscriber>_>_>_>
       ::find(&this->subs,
              (key_type *)
              ((long)&it.
                      super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Subscriber>_>,_false>
                      ._M_cur + 4));
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<Subscriber>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Subscriber>_>_>_>
       ::end(&this->subs);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (!bVar1) {
    std::
    unordered_map<int,_std::shared_ptr<Subscriber>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Subscriber>_>_>_>
    ::erase(&this->subs,(iterator)local_28._M_cur);
    __end1 = std::vector<pollfd,_std::allocator<pollfd>_>::begin(&this->fds);
    i = (pollfd *)std::vector<pollfd,_std::allocator<pollfd>_>::end(&this->fds);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>
                                       *)&i), bVar1) {
      ppVar2 = __gnu_cxx::__normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>
               ::operator*(&__end1);
      if ((ppVar2->fd ==
           it.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Subscriber>_>,_false>.
           _M_cur._4_4_) && (ppVar2->fd = -0x80000000, ppVar2->fd == 0)) {
        ppVar2->fd = -1;
      }
      __gnu_cxx::__normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>::
      operator++(&__end1);
    }
  }
  return;
}

Assistant:

void Poll::unsubscribe(Subscriber &sub) {
  int fd = sub.get_fd();
  auto it = subs.find(fd);
  if (it == this->subs.end()) {
    return;
  }
  this->subs.erase(it);
  for (auto &i: this->fds) { //TODO remove not needed fds
    if (i.fd == fd) {
      i.fd = DELETED;
      if (i.fd == 0) i.fd = -1;
    }
  }
}